

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

int sockopt_callback(void *clientp,curl_socket_t curlfd,curlsocktype purpose)

{
  uint uVar1;
  GlobalConfig *pGVar2;
  uint uVar3;
  undefined8 uVar4;
  sa_family_t sVar5;
  int iVar6;
  uint *puVar7;
  char *pcVar8;
  int __level;
  int tos;
  sockaddr addr;
  curl_socklen_t addrlen;
  uint local_4c;
  sockaddr local_48;
  socklen_t local_2c;
  
  if (purpose != CURLSOCKTYPE_IPCXN) {
    return 0;
  }
  if (0 < *(long *)((long)clientp + 0x418)) {
    local_4c = (uint)*(long *)((long)clientp + 0x418);
    local_2c = 0x10;
    local_48.sa_family = 0;
    local_48.sa_data[0] = '\0';
    local_48.sa_data[1] = '\0';
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    iVar6 = getsockname(curlfd,&local_48,&local_2c);
    if (iVar6 == 0) {
      sVar5 = local_48.sa_family;
    }
    else {
      sVar5 = 0;
    }
    if (sVar5 == 10) {
      __level = 0x29;
      iVar6 = 0x43;
    }
    else {
      if (sVar5 != 2) goto LAB_0011a0da;
      __level = 0;
      iVar6 = 1;
    }
    iVar6 = setsockopt(curlfd,__level,iVar6,&local_4c,4);
    if (iVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      uVar3 = local_4c;
      uVar1 = *puVar7;
      pGVar2 = *(GlobalConfig **)((long)clientp + 0x3b0);
      pcVar8 = strerror(uVar1);
      warnf(pGVar2,"Setting type of service to %d failed with errno %d: %s;\n",(ulong)uVar3,
            (ulong)uVar1,pcVar8);
    }
  }
LAB_0011a0da:
  if (0 < *(long *)((long)clientp + 0x420)) {
    local_48._0_4_ = (int)*(long *)((long)clientp + 0x420);
    iVar6 = setsockopt(curlfd,1,0xc,&local_48,4);
    if (iVar6 != 0) {
      puVar7 = (uint *)__errno_location();
      uVar4 = local_48._0_8_;
      uVar1 = *puVar7;
      pGVar2 = *(GlobalConfig **)((long)clientp + 0x3b0);
      pcVar8 = strerror(uVar1);
      warnf(pGVar2,"VLAN priority %d failed with errno %d: %s;\n",uVar4 & 0xffffffff,(ulong)uVar1,
            pcVar8);
    }
  }
  return 0;
}

Assistant:

static int sockopt_callback(void *clientp, curl_socket_t curlfd,
                            curlsocktype purpose)
{
  struct OperationConfig *config = (struct OperationConfig *)clientp;
  if(purpose != CURLSOCKTYPE_IPCXN)
    return CURL_SOCKOPT_OK;
  (void)config;
  (void)curlfd;
#if defined(IP_TOS) || defined(IPV6_TCLASS)
  if(config->ip_tos > 0) {
    int tos = (int)config->ip_tos;
    int result = 0;
    switch(get_address_family(curlfd)) {
    case AF_INET:
#ifdef IP_TOS
      result = setsockopt(curlfd, SOL_IP, IP_TOS, (void *)&tos, sizeof(tos));
#endif
      break;
#if defined(IPV6_TCLASS) && defined(AF_INET6)
    case AF_INET6:
      result = setsockopt(curlfd, IPPROTO_IPV6, IPV6_TCLASS,
                          (void *)&tos, sizeof(tos));
      break;
#endif
    }
    if(result < 0) {
      int error = errno;
      warnf(config->global,
            "Setting type of service to %d failed with errno %d: %s;\n",
            tos, error, strerror(error));
    }
  }
#endif
#ifdef SO_PRIORITY
  if(config->vlan_priority > 0) {
    int priority = (int)config->vlan_priority;
    if(setsockopt(curlfd, SOL_SOCKET, SO_PRIORITY,
      (void *)&priority, sizeof(priority)) != 0) {
      int error = errno;
      warnf(config->global, "VLAN priority %d failed with errno %d: %s;\n",
            priority, error, strerror(error));
    }
  }
#endif
  return CURL_SOCKOPT_OK;
}